

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::NegatePropagateStatistics::Operation<long>
               (LogicalType *type,BaseStatistics *istats,Value *new_min,Value *new_max)

{
  long lVar1;
  long lVar2;
  Value local_70;
  
  lVar1 = NumericStats::GetMax<long>(istats);
  lVar2 = NumericStats::GetMin<long>(istats);
  Value::Numeric(&local_70,type,-lVar1);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,-lVar2);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
  return false;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &istats, Value &new_min, Value &new_max) {
		auto max_value = NumericStats::GetMax<T>(istats);
		auto min_value = NumericStats::GetMin<T>(istats);
		if (!NegateOperator::CanNegate<T>(min_value) || !NegateOperator::CanNegate<T>(max_value)) {
			return true;
		}
		// new min is -max
		new_min = Value::Numeric(type, NegateOperator::Operation<T, T>(max_value));
		// new max is -min
		new_max = Value::Numeric(type, NegateOperator::Operation<T, T>(min_value));
		return false;
	}